

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O3

void __thiscall
wasm::SimplifyLocals<false,_false,_false>::~SimplifyLocals
          (SimplifyLocals<false,_false,_false> *this)

{
  ~SimplifyLocals(this);
  operator_delete(this,0x368);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }